

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<ImageBase> *src,Ptr<BufferBase> *dst,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkImageLayout layout)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdCopyImageToBuffer p_Var2;
  element_type *this_00;
  VkImage pVVar3;
  element_type *this_01;
  VkBuffer pVVar4;
  size_type sVar5;
  VkBufferImageCopy *pVVar6;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *in_RCX;
  long in_RDI;
  VkImageLayout in_R8D;
  
  p_Var2 = vkCmdCopyImageToBuffer;
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  this_00 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2acc13);
  pVVar3 = ImageBase::GetHandle(this_00);
  this_01 = std::__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2acc32);
  pVVar4 = BufferBase::GetHandle(this_01);
  sVar5 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size(in_RCX);
  pVVar6 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::data
                     ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)0x2acc57);
  (*p_Var2)(pVVar1,pVVar3,in_R8D,pVVar4,(uint32_t)sVar5,pVVar6);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<ImageBase> &src, const Ptr<BufferBase> &dst,
                            const std::vector<VkBufferImageCopy> &regions, VkImageLayout layout) const {
	vkCmdCopyImageToBuffer(m_command_buffer, src->GetHandle(), layout, dst->GetHandle(), regions.size(),
	                       regions.data());
}